

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O2

lys_module * ly_xml_resolve_prefix(ly_ctx *ctx,char *prefix,size_t prefix_len,void *prefix_data)

{
  lyxml_ns *plVar1;
  lys_module *plVar2;
  
  plVar1 = lyxml_ns_get((ly_set *)prefix_data,prefix,prefix_len);
  if (plVar1 == (lyxml_ns *)0x0) {
    plVar2 = (lys_module *)0x0;
  }
  else {
    plVar2 = ly_ctx_get_module_implemented_ns(ctx,plVar1->uri);
    if (plVar2 == (lys_module *)0x0) {
      plVar2 = ly_ctx_get_module_latest_ns(ctx,plVar1->uri);
      return plVar2;
    }
  }
  return plVar2;
}

Assistant:

static const struct lys_module *
ly_xml_resolve_prefix(const struct ly_ctx *ctx, const char *prefix, size_t prefix_len, const void *prefix_data)
{
    const struct lys_module *mod;
    const struct lyxml_ns *ns;
    const struct ly_set *ns_set = prefix_data;

    ns = lyxml_ns_get(ns_set, prefix, prefix_len);
    if (!ns) {
        return NULL;
    }

    mod = ly_ctx_get_module_implemented_ns(ctx, ns->uri);
    if (!mod) {
        /* for YIN extension prefix resolution */
        mod = ly_ctx_get_module_latest_ns(ctx, ns->uri);
    }
    return mod;
}